

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O2

void __thiscall SGParser::Generator::NFA::Or(NFA *this,NFA *b)

{
  pointer ppNVar1;
  pointer puVar2;
  NFANode *pNVar3;
  NFANode *pNVar4;
  NFANode *target;
  NFA *this_00;
  pointer ppNVar5;
  pointer puVar6;
  NFANode *local_48;
  NFANode *pfinalState;
  NFANode *local_38;
  
  if ((this != b) && (b->pStartState != (NFANode *)0x0 || this->pStartState != (NFANode *)0x0)) {
    pNVar4 = NewState(this,0);
    this_00 = this;
    target = NewState(this,0);
    local_48 = target;
    pfinalState = (NFANode *)b;
    local_38 = pNVar4;
    if (this->pStartState != (NFANode *)0x0) {
      AddLink(this_00,pNVar4,0,this->pStartState);
      ppNVar1 = (this->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar5 = (this->FinalState).
                     super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppNVar5 != ppNVar1;
          ppNVar5 = ppNVar5 + 1) {
        pNVar4 = *ppNVar5;
        AddLink(this_00,pNVar4,0,target);
        pNVar4->AcceptingState = 0;
      }
      ppNVar5 = (this->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->FinalState).
          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppNVar5) {
        (this->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppNVar5;
      }
    }
    pNVar3 = pfinalState;
    pNVar4 = (NFANode *)
             (pfinalState->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pNVar4 != (NFANode *)0x0) {
      AddLink(this_00,local_38,0,pNVar4);
      puVar2 = (pNVar3->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      for (puVar6 = (pNVar3->LinkChar).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish; puVar6 != puVar2; puVar6 = puVar6 + 2) {
        pNVar4 = *(NFANode **)puVar6;
        AddLink(this_00,pNVar4,0,target);
        pNVar4->AcceptingState = 0;
      }
      puVar6 = (pfinalState->LinkChar).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((pfinalState->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != puVar6) {
        (pfinalState->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = puVar6;
      }
    }
    pNVar4 = pfinalState;
    this->pStartState = local_38;
    target->AcceptingState = this->LexemeId;
    std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
    push_back(&this->FinalState,&local_48);
    (pNVar4->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  return;
}

Assistant:

void NFA::Or(NFA& b) {
    // Same as us
    if (this == &b)
        return;
    if (!pStartState && !b.pStartState)
        return;

    const auto pnewStartState = NewState(0u);
    const auto pfinalState    = NewState(0u);

    // Connect the start state to the start states of this and b
    // with epsilon transitions
    if (pStartState) {
        AddLink(pnewStartState, NFANode::Epsilon, pStartState);

        // Connect all the final states of a and b to the new final state
        // Make the final states of a and b no longer final states
        for (const auto fs : FinalState) {
            AddLink(fs, NFANode::Epsilon, pfinalState);
            fs->AcceptingState = 0u;
        }
        FinalState.clear();
    }
    if (b.pStartState) {
        AddLink(pnewStartState, NFANode::Epsilon, b.pStartState);

        for (const auto fs : b.FinalState) {
            AddLink(fs, NFANode::Epsilon, pfinalState);
            fs->AcceptingState = 0u;
        }
        b.FinalState.clear();
    }

    // Set new start state
    pStartState = pnewStartState;
    // Make the state final
    pfinalState->AcceptingState = LexemeId;
    FinalState.push_back(pfinalState);

    // Release b's data
    b.pStartState = nullptr;
}